

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  code *pcVar4;
  char **ppcVar5;
  FILE *pFVar6;
  size_t sVar7;
  size_t sVar8;
  char **unaff_RBX;
  ulong uVar9;
  pthread_t r;
  timespec tStack_58;
  char **ppcStack_48;
  pthread_t local_20;
  
  if (argc == 4) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"-ff");
    unaff_RBX = argv;
    if (iVar2 == 0) {
      pcVar4 = meassure_ff;
      method = 1;
    }
    else {
      iVar2 = strcmp(__s1,"-fr");
      if (iVar2 != 0) goto LAB_00101449;
      pcVar4 = meassure_fr;
      method = 0;
    }
    meassure = pcVar4;
    frequency = strtoll(argv[2],(char **)0x0,10);
    if (frequency != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = frequency;
      interval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / auVar1,0);
      ppcVar5 = (char **)strtoll(argv[3],(char **)0x0,10);
      length = (size_t)ppcVar5;
      if (ppcVar5 != (char **)0x0) {
        payload = (size_t *)malloc((long)ppcVar5 * 8);
        if (payload != (size_t *)0x0) {
          printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n- Testdata Length: %lu\n- Method: %s\n"
                 ,frequency,ppcVar5);
          pthread_create(&local_20,(pthread_attr_t *)0x0,receiver,(void *)0x0);
          pthread_join(local_20,(void **)0x0);
          pFVar6 = fopen("groupA.txt","w");
          if (length != 0) {
            uVar9 = 0;
            do {
              fprintf(pFVar6,"%lu\n",payload[uVar9]);
              uVar9 = uVar9 + 2;
            } while (uVar9 < length);
          }
          fclose(pFVar6);
          pFVar6 = fopen("groupB.txt","w");
          if (1 < length) {
            uVar9 = 1;
            do {
              fprintf(pFVar6,"%lu\n",payload[uVar9]);
              uVar9 = uVar9 + 2;
            } while (uVar9 < length);
          }
          fclose(pFVar6);
          return 0;
        }
        goto LAB_0010144e;
      }
    }
  }
LAB_00101449:
  ppcVar5 = unaff_RBX;
  main_cold_2();
LAB_0010144e:
  main_cold_1();
  ppcStack_48 = ppcVar5;
  clock_gettime(1,&tStack_58);
  sched_yield();
  sVar7 = (*meassure)(__cxa_finalize);
  *payload = sVar7;
  if (length != 1) {
    sVar7 = 1;
    do {
      uVar3 = (int)tStack_58.tv_nsec + (int)interval;
      if (999999999 < uVar3) {
        uVar3 = uVar3 + 0xc4653600;
        tStack_58.tv_sec = tStack_58.tv_sec + 1;
      }
      tStack_58.tv_nsec = (long)uVar3;
      clock_nanosleep(1,1,&tStack_58,(timespec *)0x0);
      sched_yield();
      sVar8 = (*meassure)(__cxa_finalize);
      payload[sVar7] = sVar8;
      sVar7 = sVar7 + 1;
    } while (sVar7 != length);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc == 4)
    {
        if(strcmp(argv[1], "-ff")==0)
        {
            method = FLUSH_FLUSH;
            meassure = meassure_ff;
        }
        else
        {
            if(strcmp(argv[1], "-fr")==0)
            {
                method = FLUSH_RELOAD;
                meassure = meassure_fr;
            }
            else
            {
                goto invalid;
            }
        }

        frequency = strtoll(argv[2], NULL, 10);
        if(frequency==0) goto invalid;
        // interval in nsecs
        interval = 1000000000/frequency;

        length = strtoll(argv[3], NULL, 10);
        if(length==0) goto invalid;
    }
    else
    {
        invalid:
        fprintf(stderr, "usage: ./meassure_recv [-ff/-fr] [FREQUENCY] [TESTPOINTS]\n");
        exit(1);
    }

    payload = malloc(sizeof(size_t)*length);
    if(!payload){fprintf(stderr, "could not allocate memory\n"); exit(2);}


    printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n"
           "- Testdata Length: %lu\n"
           "- Method: %s\n",
           frequency, length, method == FLUSH_FLUSH ? "Flush+Flush" : "Flush+Reload");

    pthread_t r;
    pthread_create(&r, NULL, receiver, NULL);
    pthread_join(r, NULL);

    {
        FILE* group_A = fopen("groupA.txt", "w");
        for(int i = 0; i < length; i+=2)
        {
            fprintf(group_A, "%lu\n", payload[i]);
        }

        fclose(group_A);

        FILE* group_B = fopen("groupB.txt", "w");
        for(int i = 1; i < length; i+=2)
        {
            fprintf(group_B, "%lu\n", payload[i]);
        }
        fclose(group_B);
    }

    return 0;
}